

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLMaterialLoader.cpp
# Opt level: O2

void __thiscall
Assimp::MDLImporter::CreateTexture_3DGS_MDL5
          (MDLImporter *this,uchar *szData,uint iType,uint *piSkip)

{
  uchar *szData_00;
  uint *puVar1;
  uint uVar2;
  aiScene *paVar3;
  uint i;
  aiTexture *pcNew;
  aiTexel *__dest;
  aiTexture **ppaVar4;
  ulong uVar5;
  aiTexture **ppaVar6;
  
  if (piSkip == (uint *)0x0) {
    __assert_fail("__null != piSkip",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
                  ,0x197,
                  "void Assimp::MDLImporter::CreateTexture_3DGS_MDL5(const unsigned char *, unsigned int, unsigned int *)"
                 );
  }
  uVar2 = *piSkip;
  pcNew = (aiTexture *)operator_new(0x428);
  pcNew->mWidth = 0;
  pcNew->mHeight = 0;
  pcNew->pcData = (aiTexel *)0x0;
  (pcNew->mFilename).length = 0;
  (pcNew->mFilename).data[0] = '\0';
  memset((pcNew->mFilename).data + 1,0x1b,0x3ff);
  pcNew->achFormatHint[0] = '\0';
  pcNew->achFormatHint[1] = '\0';
  pcNew->achFormatHint[2] = '\0';
  pcNew->achFormatHint[3] = '\0';
  szData_00 = szData + 8;
  SizeCheck(this,szData_00,
            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
            ,0x19d);
  uVar5 = *(ulong *)szData;
  pcNew->mWidth = (int)uVar5;
  pcNew->mHeight = (int)(uVar5 >> 0x20);
  if (uVar2 == 0xffffffff) {
    pcNew->pcData = (aiTexel *)0xffffffffffffffff;
  }
  if (iType == 6) {
    *piSkip = (uint)uVar5;
    SizeCheck(this,szData_00 + (uVar5 & 0xffffffff),
              "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/MDL/MDLMaterialLoader.cpp"
              ,0x1b4);
    if (uVar2 == 0xffffffff) {
      *piSkip = *piSkip + 8;
LAB_0043b1d4:
      pcNew->pcData = (aiTexel *)0x0;
      aiTexture::~aiTexture(pcNew);
      operator_delete(pcNew);
      return;
    }
    pcNew->mHeight = 0;
    builtin_strncpy(pcNew->achFormatHint,"dds",4);
    uVar2 = pcNew->mWidth;
    __dest = (aiTexel *)operator_new__((ulong)uVar2);
    pcNew->pcData = __dest;
    memcpy(__dest,szData_00,(ulong)uVar2);
    *piSkip = *piSkip + 8;
  }
  else {
    ParseTextureColorData(this,szData_00,iType,piSkip,pcNew);
    *piSkip = *piSkip + 8;
    if (uVar2 == 0xffffffff) goto LAB_0043b1d4;
  }
  paVar3 = this->pScene;
  if (paVar3->mNumTextures == 0) {
    paVar3->mNumTextures = 1;
    ppaVar6 = (aiTexture **)operator_new__(8);
    this->pScene->mTextures = ppaVar6;
    *this->pScene->mTextures = pcNew;
  }
  else {
    ppaVar6 = paVar3->mTextures;
    ppaVar4 = (aiTexture **)operator_new__((ulong)(paVar3->mNumTextures + 1) << 3);
    paVar3->mTextures = ppaVar4;
    uVar5 = 0;
    while( true ) {
      paVar3 = this->pScene;
      if (paVar3->mNumTextures <= uVar5) break;
      paVar3->mTextures[uVar5] = ppaVar6[uVar5];
      uVar5 = uVar5 + 1;
    }
    paVar3->mTextures[paVar3->mNumTextures] = pcNew;
    puVar1 = &this->pScene->mNumTextures;
    *puVar1 = *puVar1 + 1;
    if (ppaVar6 != (aiTexture **)0x0) {
      operator_delete__(ppaVar6);
      return;
    }
  }
  return;
}

Assistant:

void MDLImporter::CreateTexture_3DGS_MDL5(const unsigned char* szData,
    unsigned int iType,
    unsigned int* piSkip)
{
    ai_assert(NULL != piSkip);
    bool bNoRead = *piSkip == UINT_MAX;

    // allocate a new texture object
    aiTexture* pcNew = new aiTexture();

    VALIDATE_FILE_SIZE(szData+8);

    // first read the size of the texture
    pcNew->mWidth = *((uint32_t*)szData);
    AI_SWAP4(pcNew->mWidth);
    szData += sizeof(uint32_t);

    pcNew->mHeight = *((uint32_t*)szData);
    AI_SWAP4(pcNew->mHeight);
    szData += sizeof(uint32_t);

    if (bNoRead) {
        pcNew->pcData = bad_texel;
    }

    // this should not occur - at least the docs say it shouldn't.
    // however, one can easily try out what MED does if you have
    // a model with a DDS texture and export it to MDL5 ...
    // yeah, it embedds the DDS file.
    if (6 == iType)
    {
        // this is a compressed texture in DDS format
        *piSkip = pcNew->mWidth;
        VALIDATE_FILE_SIZE(szData + *piSkip);

        if (!bNoRead)
        {
            // place a hint and let the application know that this is a DDS file
            pcNew->mHeight = 0;
            pcNew->achFormatHint[0] = 'd';
            pcNew->achFormatHint[1] = 'd';
            pcNew->achFormatHint[2] = 's';
            pcNew->achFormatHint[3] = '\0';

            pcNew->pcData = (aiTexel*) new unsigned char[pcNew->mWidth];
            ::memcpy(pcNew->pcData,szData,pcNew->mWidth);
        }
    }
    else
    {
        // parse the color data of the texture
        ParseTextureColorData(szData,iType,piSkip,pcNew);
    }
    *piSkip += sizeof(uint32_t) * 2;

    if (!bNoRead)
    {
        // store the texture
        if (!this->pScene->mNumTextures)
        {
            pScene->mNumTextures = 1;
            pScene->mTextures = new aiTexture*[1];
            pScene->mTextures[0] = pcNew;
        }
        else
        {
            aiTexture** pc = pScene->mTextures;
            pScene->mTextures = new aiTexture*[pScene->mNumTextures+1];
            for (unsigned int i = 0; i < pScene->mNumTextures;++i)
                this->pScene->mTextures[i] = pc[i];

            pScene->mTextures[pScene->mNumTextures] = pcNew;
            pScene->mNumTextures++;
            delete[] pc;
        }
    }
    else {
        pcNew->pcData = NULL;
        delete pcNew;
    }
    return;
}